

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::DatatypeValidator::getWSstring(DatatypeValidator *this,short theType)

{
  undefined1 *puVar1;
  
  if (theType == 1) {
    puVar1 = SchemaSymbols::fgWS_REPLACE;
  }
  else {
    puVar1 = SchemaSymbols::fgWS_PRESERVE;
  }
  if (theType == 2) {
    puVar1 = SchemaSymbols::fgWS_COLLAPSE;
  }
  return (XMLCh *)puVar1;
}

Assistant:

const XMLCh* DatatypeValidator::getWSstring(const short theType) const
{
    switch (theType)
    {
    case PRESERVE:
         return SchemaSymbols::fgWS_PRESERVE;
    case REPLACE:
         return SchemaSymbols::fgWS_REPLACE;
    case COLLAPSE:
         return SchemaSymbols::fgWS_COLLAPSE;
    default:
         return SchemaSymbols::fgWS_PRESERVE;
    }

}